

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::Player(Player *this)

{
  PhaseObserver *this_00;
  GameStatisticsObserver *this_01;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_3a0;
  allocator local_39f;
  allocator local_39e;
  allocator local_39d;
  allocator local_39c;
  allocator local_39b;
  allocator local_39a;
  allocator local_399;
  vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_> buildingUnitTiles;
  vector<GameTokens,_std::allocator<GameTokens>_> gameTokens;
  vector<Cards,_std::allocator<Cards>_> cards;
  Dice dice;
  string local_200 [32];
  string local_1e0 [32];
  BoardFigures boardFigure;
  MonsterCards monsterCard;
  
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_00121940;
  (this->playerName)._M_dataplus._M_p = (pointer)&(this->playerName).field_2;
  (this->playerName)._M_string_length = 0;
  (this->playerName).field_2._M_local_buf[0] = '\0';
  MonsterCards::MonsterCards(&this->monsterCard);
  MonsterCards::MonsterCards(&(this->boardFigure).super_MonsterCards);
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&dice,"Manhattan",(allocator *)&monsterCard);
  std::__cxx11::string::string
            ((string *)(dice.DiceNames + 2),"Manhattan Lower 2-4",(allocator *)&boardFigure);
  std::__cxx11::string::string
            ((string *)&dice.DiceValues,"Manhattan Midtown 2-4",(allocator *)&cards);
  std::__cxx11::string::string
            ((string *)&dice.DiceValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             "Manhattan Upper 2-4",(allocator *)&gameTokens);
  std::__cxx11::string::string
            ((string *)&dice.resolvedHand._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             "Manhattan Lower 5-6",(allocator *)&buildingUnitTiles);
  std::__cxx11::string::string((string *)&dice.playerNumber,"Manhattan Midtown 5-6",&local_399);
  std::__cxx11::string::string
            ((string *)
             &dice.historyOfResolvedRolls.
              super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Manhattan Upper 5-6",&local_39a);
  std::__cxx11::string::string((string *)&dice.it,"Bronx",&local_39b);
  std::__cxx11::string::string((string *)&dice.diceMap,"Queens",&local_39c);
  std::__cxx11::string::string
            ((string *)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             "Staten Island",&local_39d);
  std::__cxx11::string::string(local_200,"Brooklyn",&local_39e);
  std::__cxx11::string::string(local_1e0,"None",&local_39f);
  __l._M_len = 0xc;
  __l._M_array = (iterator)&dice;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->zoneNames,__l,&local_3a0);
  lVar1 = 0x160;
  do {
    std::__cxx11::string::~string((string *)((long)dice.DiceNames + lVar1 + -0x10));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  this->victoryPoints = 0;
  this->lifePoints = 10;
  this->energyCubes = 0;
  Dice::Dice(&dice);
  MonsterCards::MonsterCards(&monsterCard);
  MonsterCards::MonsterCards(&boardFigure.super_MonsterCards);
  cards.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cards.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cards.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  gameTokens.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gameTokens.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gameTokens.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildingUnitTiles.super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buildingUnitTiles.super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buildingUnitTiles.super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (PhaseObserver *)operator_new(0x10);
  PhaseObserver::PhaseObserver(this_00,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_00);
  this_01 = (GameStatisticsObserver *)operator_new(8);
  (this_01->super_Observer)._vptr_Observer = (_func_int **)0x0;
  GameStatisticsObserver::GameStatisticsObserver(this_01);
  (**(this->super_Subject)._vptr_Subject)(this,this_01);
  std::_Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::~_Vector_base
            (&buildingUnitTiles.
              super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector(&gameTokens);
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&cards);
  MonsterCards::~MonsterCards(&boardFigure.super_MonsterCards);
  MonsterCards::~MonsterCards(&monsterCard);
  Dice::~Dice(&dice);
  return;
}

Assistant:

Player::Player() {
    victoryPoints = 0;
    lifePoints= 10;
    energyCubes = 0;

    Dice dice; // Player dice obj
    MonsterCards monsterCard; // Player monster card
    BoardFigures boardFigure; // Player board fig
    vector <Cards> cards; //List of all deck cards assigned to player (purchased)
    vector <GameTokens> gameTokens; // List of all game tokens assigned to player
    vector <BuildingUnitTiles> buildingUnitTiles; // List of all building tiles assigned to player

    attach(new PhaseObserver(this));
    attach(new GameStatisticsObserver());
}